

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O1

bool __thiscall
re2::Prog::SearchBitState
          (Prog *this,StringPiece *text,StringPiece *context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  bool bVar1;
  int nsubmatch;
  StringPiece *submatch;
  BitState b;
  StringPiece local_b0;
  BitState local_a0;
  
  local_b0.ptr_ = (char *)0x0;
  local_b0.length_ = 0;
  nsubmatch = 1;
  if (1 < nmatch) {
    nsubmatch = nmatch;
  }
  submatch = match;
  if (nmatch < 1) {
    submatch = &local_b0;
  }
  if (kind != kFullMatch) {
    submatch = match;
    nsubmatch = nmatch;
  }
  local_a0.text_.ptr_ = (char *)0x0;
  local_a0.text_.length_ = 0;
  local_a0.context_.ptr_ = (char *)0x0;
  local_a0.context_.length_ = 0;
  local_a0.anchored_ = false;
  local_a0.longest_ = false;
  local_a0.endmatch_ = false;
  local_a0.submatch_ = (StringPiece *)0x0;
  local_a0.nsubmatch_ = 0;
  local_a0.cap_ = (char **)0x0;
  local_a0.ncap_ = 0;
  local_a0.visited_ = (uint32 *)0x0;
  local_a0.nvisited_ = 0;
  local_a0.job_ = (Job *)0x0;
  local_a0.njob_ = 0;
  local_a0.maxjob_ = 0;
  local_a0.prog_ = this;
  bVar1 = BitState::Search(&local_a0,text,context,anchor == kAnchored || kind == kFullMatch,
                           kind != kFirstMatch,submatch,nsubmatch);
  if (bVar1) {
    if (kind == kFullMatch) {
      if (nmatch < 1) {
        match = &local_b0;
      }
      if (submatch->ptr_ + match->length_ != text->ptr_ + text->length_) goto LAB_0012f5f6;
    }
    bVar1 = true;
  }
  else {
LAB_0012f5f6:
    bVar1 = false;
  }
  BitState::~BitState(&local_a0);
  return bVar1;
}

Assistant:

bool Prog::SearchBitState(const StringPiece& text,
                          const StringPiece& context,
                          Anchor anchor,
                          MatchKind kind,
                          StringPiece* match,
                          int nmatch) {
  // If full match, we ask for an anchored longest match
  // and then check that match[0] == text.
  // So make sure match[0] exists.
  StringPiece sp0;
  if (kind == kFullMatch) {
    anchor = kAnchored;
    if (nmatch < 1) {
      match = &sp0;
      nmatch = 1;
    }
  }

  // Run the search.
  BitState b(this);
  bool anchored = anchor == kAnchored;
  bool longest = kind != kFirstMatch;
  if (!b.Search(text, context, anchored, longest, match, nmatch))
    return false;
  if (kind == kFullMatch && match[0].end() != text.end())
    return false;
  return true;
}